

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O2

int skeinUpdate(SkeinCtx_t *ctx,uint8_t *msg,size_t msgByteCnt)

{
  u64b_t uVar1;
  int iVar2;
  
  if (ctx != (SkeinCtx_t *)0x0) {
    uVar1 = ctx->skeinSize;
    if (uVar1 == 0x400) {
      iVar2 = Skein1024_Update(&(ctx->m).s1024,msg,msgByteCnt);
      return iVar2;
    }
    if (uVar1 == 0x200) {
      iVar2 = Skein_512_Update(&(ctx->m).s512,msg,msgByteCnt);
      return iVar2;
    }
    if (uVar1 == 0x100) {
      iVar2 = Skein_256_Update(&(ctx->m).s256,msg,msgByteCnt);
      return iVar2;
    }
  }
  return 1;
}

Assistant:

int skeinUpdate(SkeinCtx_t *ctx, const uint8_t *msg,
                size_t msgByteCnt)
{
    int ret = SKEIN_FAIL;
    Skein_Assert(ctx, SKEIN_FAIL);

    switch (ctx->skeinSize) {
    case Skein256:
        ret = Skein_256_Update(&ctx->m.s256, (const u08b_t*)msg, msgByteCnt);
        break;
    case Skein512:
        ret = Skein_512_Update(&ctx->m.s512, (const u08b_t*)msg, msgByteCnt);
        break;
    case Skein1024:
        ret = Skein1024_Update(&ctx->m.s1024, (const u08b_t*)msg, msgByteCnt);
        break;
    }
    return ret;

}